

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilnam.cpp
# Opt level: O0

vm_obj_id_t CVmObjFileName::create_from_url(char *str,size_t len)

{
  undefined8 *puVar1;
  long *plVar2;
  int unaff_retaddr;
  size_t in_stack_00000008;
  char *in_stack_00000010;
  err_frame_t err_cur__;
  vm_obj_id_t fn;
  char *lcl;
  size_t in_stack_fffffffffffffee8;
  void *pvVar3;
  char *in_stack_fffffffffffffef0;
  undefined8 uVar4;
  uint local_100 [2];
  undefined8 local_f8;
  void *local_f0;
  __jmp_buf_tag _Stack_e8;
  vm_obj_id_t local_1c;
  char *local_18;
  
  local_18 = (char *)0x0;
  local_1c = 0;
  puVar1 = (undefined8 *)_ZTW11G_err_frame();
  local_f8 = *puVar1;
  plVar2 = (long *)_ZTW11G_err_frame();
  *plVar2 = (long)local_100;
  local_100[0] = _setjmp(&_Stack_e8);
  if (local_100[0] == 0) {
    local_18 = url_to_local(in_stack_00000010,in_stack_00000008,unaff_retaddr);
    strlen(local_18);
    local_1c = create_from_local(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  }
  if ((local_100[0] & 0x8000) == 0) {
    local_100[0] = local_100[0] | 0x8000;
    lib_free_str((char *)0x33cc44);
  }
  uVar4 = local_f8;
  puVar1 = (undefined8 *)_ZTW11G_err_frame();
  *puVar1 = uVar4;
  if ((local_100[0] & 0x4001) != 0) {
    puVar1 = (undefined8 *)_ZTW11G_err_frame();
    if ((*(uint *)*puVar1 & 2) != 0) {
      plVar2 = (long *)_ZTW11G_err_frame();
      free(*(void **)(*plVar2 + 0x10));
    }
    pvVar3 = local_f0;
    plVar2 = (long *)_ZTW11G_err_frame();
    *(void **)(*plVar2 + 0x10) = pvVar3;
    err_rethrow();
  }
  if ((local_100[0] & 2) != 0) {
    free(local_f0);
  }
  return local_1c;
}

Assistant:

vm_obj_id_t CVmObjFileName::create_from_url(VMG_ const char *str, size_t len)
{
    char *lcl = 0;
    vm_obj_id_t fn = VM_INVALID_OBJ;
    err_try
    {
        /* convert to local notation */
        lcl = url_to_local(vmg_ str, len, FALSE);

        /* create the FileName object */
        fn = create_from_local(vmg_ lcl, strlen(lcl));
    }